

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_b.h
# Opt level: O2

arena_t * arena_choose(tsd_t *tsd,arena_t *arena)

{
  arena_t *paVar1;
  arena_t *paVar2;
  
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
    paVar2 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
    if (paVar2 == (arena_t *)0x0) {
      paVar2 = duckdb_je_arena_choose_hard(tsd,false);
      if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true) {
        paVar1 = (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow).arena;
        if (paVar1 == (arena_t *)0x0) {
          duckdb_je_tcache_arena_associate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,paVar2);
        }
        else if (paVar1 != paVar2) {
          duckdb_je_tcache_arena_reassociate
                    ((tsdn_t *)tsd,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow,
                     &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,paVar2);
        }
      }
    }
    return paVar2;
  }
  paVar2 = arena_get((tsdn_t *)tsd,0,true);
  return paVar2;
}

Assistant:

static inline arena_t *
arena_choose(tsd_t *tsd, arena_t *arena) {
	return arena_choose_impl(tsd, arena, false);
}